

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

xmlRegexpPtr xmlRegEpxFromParse(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  xmlRegAtomPtr pxVar2;
  xmlRegStatePtr pxVar3;
  xmlRegTrans *pxVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  xmlRegexpPtr comp;
  xmlChar **ppxVar11;
  xmlChar **ppxVar12;
  xmlChar *pxVar13;
  int *__s;
  size_t __n;
  void **__s_00;
  long lVar14;
  long lVar15;
  uint uVar16;
  size_t __n_00;
  long lVar17;
  xmlRegStatePtr *ppxVar18;
  xmlRegAtomPtr *ppxVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  xmlChar **local_a0;
  
  comp = (xmlRegexpPtr)(*xmlMalloc)(0x68);
  if (comp == (xmlRegexpPtr)0x0) {
    ctxt->error = 2;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                        (xmlError *)0x0);
    return (xmlRegexpPtr)0x0;
  }
  comp->transdata = (void **)0x0;
  *(undefined8 *)&comp->nbstrings = 0;
  *(undefined8 *)&comp->nbstates = 0;
  comp->compact = (int *)0x0;
  comp->counters = (xmlRegCounter *)0x0;
  comp->determinist = 0;
  comp->flags = 0;
  comp->atoms = (xmlRegAtomPtr *)0x0;
  *(undefined8 *)&comp->nbCounters = 0;
  comp->states = (xmlRegStatePtr *)0x0;
  *(undefined8 *)&comp->nbAtoms = 0;
  comp->string = (xmlChar *)0x0;
  *(undefined8 *)&comp->nbStates = 0;
  comp->stringMap = (xmlChar **)0x0;
  comp->string = ctxt->string;
  comp->nbStates = ctxt->nbStates;
  comp->states = ctxt->states;
  comp->nbAtoms = ctxt->nbAtoms;
  comp->atoms = ctxt->atoms;
  comp->nbCounters = ctxt->nbCounters;
  comp->counters = ctxt->counters;
  iVar8 = ctxt->determinist;
  comp->determinist = iVar8;
  comp->flags = ctxt->flags;
  if (iVar8 == -1) {
    iVar8 = xmlRegexpIsDeterminist(comp);
    if (iVar8 < 0) goto LAB_0017ca88;
    iVar8 = comp->determinist;
  }
  if ((((iVar8 == 0) || (comp->nbCounters != 0)) || (ctxt->negs != 0)) ||
     (((comp->atoms == (xmlRegAtomPtr *)0x0 || (pxVar2 = *comp->atoms, pxVar2 == (xmlRegAtomPtr)0x0)
       ) || (pxVar2->type != XML_REGEXP_STRING)))) goto LAB_0017c9da;
  ppxVar11 = (xmlChar **)(*xmlMalloc)((long)comp->nbStates << 2);
  if (ppxVar11 == (xmlChar **)0x0) {
LAB_0017ca88:
    ctxt->error = 2;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                        (xmlError *)0x0);
    (*xmlFree)(comp);
    return (xmlRegexpPtr)0x0;
  }
  if (comp->nbStates < 1) {
    uVar21 = 0;
  }
  else {
    ppxVar18 = comp->states;
    lVar14 = 0;
    uVar16 = 0;
    do {
      uVar21 = (uVar16 + 1) - (uint)(ppxVar18[lVar14] == (xmlRegStatePtr)0x0);
      *(uint *)((long)ppxVar11 + lVar14 * 4) =
           -(uint)(ppxVar18[lVar14] == (xmlRegStatePtr)0x0) | uVar16;
      lVar14 = lVar14 + 1;
      uVar16 = uVar21;
    } while (lVar14 < comp->nbStates);
  }
  local_a0 = (xmlChar **)(*xmlMalloc)((long)comp->nbAtoms << 3);
  if (local_a0 == (xmlChar **)0x0) {
    ctxt->error = 2;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                        (xmlError *)0x0);
    local_a0 = ppxVar11;
    goto LAB_0017cf66;
  }
  ppxVar12 = (xmlChar **)(*xmlMalloc)((long)comp->nbAtoms << 2);
  if (ppxVar12 == (xmlChar **)0x0) {
    ctxt->error = 2;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                        (xmlError *)0x0);
    (*xmlFree)(local_a0);
    local_a0 = ppxVar11;
    goto LAB_0017cf66;
  }
  if (comp->nbAtoms < 1) {
    uVar16 = 0;
    iVar8 = 1;
    uVar22 = 1;
LAB_0017cc3f:
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar22;
    if ((ulong)(long)(int)(uVar21 + 1) <=
        SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar6,0) >> 2) {
      __n_00 = (long)(int)(uVar21 + 1) * uVar22 * 4;
      __s = (int *)(*xmlMalloc)(__n_00);
      if (__s != (int *)0x0) {
        memset(__s,0,__n_00);
        if (comp->nbStates < 1) {
          comp->determinist = 1;
          ppxVar18 = comp->states;
          __s_00 = (void **)0x0;
          if (ppxVar18 != (xmlRegStatePtr *)0x0) goto LAB_0017cfec;
        }
        else {
          __n = (long)(int)uVar21 * (long)(int)uVar16 * 8;
          lVar14 = 0;
          __s_00 = (void **)0x0;
          do {
            iVar9 = *(int *)((long)ppxVar11 + lVar14 * 4);
            if (iVar9 != -1) {
              pxVar3 = comp->states[lVar14];
              __s[iVar9 * iVar8] = pxVar3->type;
              if (0 < pxVar3->nbTrans) {
                lVar17 = 8;
                lVar23 = 0;
                do {
                  pxVar4 = pxVar3->trans;
                  iVar10 = *(int *)((long)&pxVar4->atom + lVar17);
                  if ((-1 < iVar10) &&
                     (piVar5 = *(int **)((long)pxVar4 + lVar17 + -8), piVar5 != (int *)0x0)) {
                    iVar1 = *(int *)((long)ppxVar12 + (long)*piVar5 * 4);
                    if ((*(long *)(piVar5 + 0x16) != 0) && (__s_00 == (void **)0x0)) {
                      if (((uVar16 == 0) ||
                          (auVar7._8_8_ = 0, auVar7._0_8_ = (long)(int)uVar16,
                          SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar7,0) >> 3
                          < (ulong)(long)(int)uVar21)) ||
                         (__s_00 = (void **)(*xmlMalloc)(__n), __s_00 == (void **)0x0)) {
                        ctxt->error = 2;
                        xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,
                                            (void *)0x0,0xe,(xmlError *)0x0);
                        __s_00 = (void **)0x0;
                        break;
                      }
                      memset(__s_00,0,__n);
                      iVar10 = *(int *)((long)&pxVar4->atom + lVar17);
                    }
                    lVar15 = (long)(iVar1 + iVar9 * iVar8);
                    iVar10 = *(int *)((long)ppxVar11 + (long)iVar10 * 4) + 1;
                    if (__s[lVar15 + 1] == 0) {
                      __s[lVar15 + 1] = iVar10;
                      if (__s_00 == (void **)0x0) {
                        __s_00 = (void **)0x0;
                      }
                      else {
                        __s_00[(int)(iVar1 + iVar9 * uVar16)] =
                             *(void **)(*(long *)((long)pxVar4 + lVar17 + -8) + 0x58);
                      }
                    }
                    else if (__s[lVar15 + 1] != iVar10) {
                      comp->determinist = 0;
                      if (__s_00 != (void **)0x0) {
                        (*xmlFree)(__s_00);
                      }
                      (*xmlFree)(__s);
                      (*xmlFree)(ppxVar11);
                      (*xmlFree)(ppxVar12);
                      if (0 < (int)uVar16) {
                        uVar20 = 0;
                        do {
                          (*xmlFree)(local_a0[uVar20]);
                          uVar20 = uVar20 + 1;
                        } while (uVar16 != uVar20);
                      }
                      goto LAB_0017d07d;
                    }
                  }
                  lVar23 = lVar23 + 1;
                  lVar17 = lVar17 + 0x18;
                } while (lVar23 < pxVar3->nbTrans);
              }
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < comp->nbStates);
          comp->determinist = 1;
          ppxVar18 = comp->states;
          if (ppxVar18 != (xmlRegStatePtr *)0x0) {
            if (0 < comp->nbStates) {
              lVar14 = 0;
              do {
                xmlRegFreeState(comp->states[lVar14]);
                lVar14 = lVar14 + 1;
              } while (lVar14 < comp->nbStates);
              ppxVar18 = comp->states;
            }
LAB_0017cfec:
            (*xmlFree)(ppxVar18);
          }
        }
        comp->states = (xmlRegStatePtr *)0x0;
        comp->nbStates = 0;
        ppxVar19 = comp->atoms;
        if (ppxVar19 != (xmlRegAtomPtr *)0x0) {
          if (0 < comp->nbAtoms) {
            lVar14 = 0;
            do {
              xmlRegFreeAtom(comp->atoms[lVar14]);
              lVar14 = lVar14 + 1;
            } while (lVar14 < comp->nbAtoms);
            ppxVar19 = comp->atoms;
          }
          (*xmlFree)(ppxVar19);
        }
        comp->atoms = (xmlRegAtomPtr *)0x0;
        comp->nbAtoms = 0;
        comp->compact = __s;
        comp->transdata = __s_00;
        comp->stringMap = local_a0;
        comp->nbstrings = uVar16;
        comp->nbstates = uVar21;
        (*xmlFree)(ppxVar11);
        local_a0 = ppxVar12;
LAB_0017d07d:
        (*xmlFree)(local_a0);
LAB_0017c9da:
        ctxt->string = (xmlChar *)0x0;
        ctxt->nbStates = 0;
        ctxt->states = (xmlRegStatePtr *)0x0;
        ctxt->nbAtoms = 0;
        ctxt->atoms = (xmlRegAtomPtr *)0x0;
        ctxt->nbCounters = 0;
        ctxt->counters = (xmlRegCounter *)0x0;
        return comp;
      }
    }
  }
  else {
    lVar14 = 0;
    uVar20 = 0;
    do {
      iVar8 = (int)uVar20;
      pxVar2 = comp->atoms[lVar14];
      if ((pxVar2->type != XML_REGEXP_STRING) || (pxVar2->quant != XML_REGEXP_QUANT_ONCE)) {
        (*xmlFree)(ppxVar11);
        (*xmlFree)(ppxVar12);
        if (0 < iVar8) {
          uVar22 = 0;
          do {
            (*xmlFree)(local_a0[uVar22]);
            uVar22 = uVar22 + 1;
          } while (uVar20 != uVar22);
        }
        goto LAB_0017cf66;
      }
      pxVar13 = (xmlChar *)pxVar2->valuep;
      if (0 < iVar8) {
        uVar22 = 0;
        do {
          iVar9 = xmlStrEqual(local_a0[uVar22],pxVar13);
          if (iVar9 != 0) {
            *(int *)((long)ppxVar12 + lVar14 * 4) = (int)uVar22;
            goto LAB_0017cbaf;
          }
          uVar22 = uVar22 + 1;
        } while (uVar20 != uVar22);
      }
      *(int *)((long)ppxVar12 + lVar14 * 4) = iVar8;
      pxVar13 = xmlStrdup(pxVar13);
      local_a0[iVar8] = pxVar13;
      if (pxVar13 == (xmlChar *)0x0) {
        if (0 < iVar8) {
          uVar22 = 0;
          do {
            (*xmlFree)(local_a0[uVar22]);
            uVar22 = uVar22 + 1;
          } while (uVar20 != uVar22);
        }
        (*xmlFree)(ppxVar12);
        (*xmlFree)(local_a0);
        local_a0 = ppxVar11;
        goto LAB_0017cf66;
      }
      uVar20 = (ulong)(iVar8 + 1);
LAB_0017cbaf:
      lVar14 = lVar14 + 1;
    } while (lVar14 < comp->nbAtoms);
    uVar16 = 0xffffffff;
    iVar8 = (uint)uVar20 + 1;
    if (iVar8 != 0) {
      uVar22 = (ulong)iVar8;
      uVar16 = (uint)uVar20;
      goto LAB_0017cc3f;
    }
  }
  (*xmlFree)(ppxVar11);
  (*xmlFree)(ppxVar12);
  if (0 < (int)uVar16) {
    uVar20 = 0;
    do {
      (*xmlFree)(local_a0[uVar20]);
      uVar20 = uVar20 + 1;
    } while (uVar16 != uVar20);
  }
LAB_0017cf66:
  (*xmlFree)(local_a0);
  (*xmlFree)(comp);
  return (xmlRegexpPtr)0x0;
}

Assistant:

static xmlRegexpPtr
xmlRegEpxFromParse(xmlRegParserCtxtPtr ctxt) {
    xmlRegexpPtr ret;

    ret = (xmlRegexpPtr) xmlMalloc(sizeof(xmlRegexp));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlRegexp));
    ret->string = ctxt->string;
    ret->nbStates = ctxt->nbStates;
    ret->states = ctxt->states;
    ret->nbAtoms = ctxt->nbAtoms;
    ret->atoms = ctxt->atoms;
    ret->nbCounters = ctxt->nbCounters;
    ret->counters = ctxt->counters;
    ret->determinist = ctxt->determinist;
    ret->flags = ctxt->flags;
    if (ret->determinist == -1) {
        if (xmlRegexpIsDeterminist(ret) < 0) {
            xmlRegexpErrMemory(ctxt);
            xmlFree(ret);
            return(NULL);
        }
    }

    if ((ret->determinist != 0) &&
	(ret->nbCounters == 0) &&
	(ctxt->negs == 0) &&
	(ret->atoms != NULL) &&
	(ret->atoms[0] != NULL) &&
	(ret->atoms[0]->type == XML_REGEXP_STRING)) {
	int i, j, nbstates = 0, nbatoms = 0;
	int *stateRemap;
	int *stringRemap;
	int *transitions;
	void **transdata;
	xmlChar **stringMap;
        xmlChar *value;

	/*
	 * Switch to a compact representation
	 * 1/ counting the effective number of states left
	 * 2/ counting the unique number of atoms, and check that
	 *    they are all of the string type
	 * 3/ build a table state x atom for the transitions
	 */

	stateRemap = xmlMalloc(ret->nbStates * sizeof(int));
	if (stateRemap == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    xmlFree(ret);
	    return(NULL);
	}
	for (i = 0;i < ret->nbStates;i++) {
	    if (ret->states[i] != NULL) {
		stateRemap[i] = nbstates;
		nbstates++;
	    } else {
		stateRemap[i] = -1;
	    }
	}
	stringMap = xmlMalloc(ret->nbAtoms * sizeof(char *));
	if (stringMap == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    xmlFree(stateRemap);
	    xmlFree(ret);
	    return(NULL);
	}
	stringRemap = xmlMalloc(ret->nbAtoms * sizeof(int));
	if (stringRemap == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    xmlFree(stringMap);
	    xmlFree(stateRemap);
	    xmlFree(ret);
	    return(NULL);
	}
	for (i = 0;i < ret->nbAtoms;i++) {
	    if ((ret->atoms[i]->type == XML_REGEXP_STRING) &&
		(ret->atoms[i]->quant == XML_REGEXP_QUANT_ONCE)) {
		value = ret->atoms[i]->valuep;
                for (j = 0;j < nbatoms;j++) {
		    if (xmlStrEqual(stringMap[j], value)) {
			stringRemap[i] = j;
			break;
		    }
		}
		if (j >= nbatoms) {
		    stringRemap[i] = nbatoms;
		    stringMap[nbatoms] = xmlStrdup(value);
		    if (stringMap[nbatoms] == NULL) {
			for (i = 0;i < nbatoms;i++)
			    xmlFree(stringMap[i]);
			xmlFree(stringRemap);
			xmlFree(stringMap);
			xmlFree(stateRemap);
			xmlFree(ret);
			return(NULL);
		    }
		    nbatoms++;
		}
	    } else {
		xmlFree(stateRemap);
		xmlFree(stringRemap);
		for (i = 0;i < nbatoms;i++)
		    xmlFree(stringMap[i]);
		xmlFree(stringMap);
		xmlFree(ret);
		return(NULL);
	    }
	}
	transitions = (int *) xmlRegCalloc2(nbstates + 1, nbatoms + 1,
                                            sizeof(int));
	if (transitions == NULL) {
	    xmlFree(stateRemap);
	    xmlFree(stringRemap);
            for (i = 0;i < nbatoms;i++)
		xmlFree(stringMap[i]);
	    xmlFree(stringMap);
	    xmlFree(ret);
	    return(NULL);
	}

	/*
	 * Allocate the transition table. The first entry for each
	 * state corresponds to the state type.
	 */
	transdata = NULL;

	for (i = 0;i < ret->nbStates;i++) {
	    int stateno, atomno, targetno, prev;
	    xmlRegStatePtr state;
	    xmlRegTransPtr trans;

	    stateno = stateRemap[i];
	    if (stateno == -1)
		continue;
	    state = ret->states[i];

	    transitions[stateno * (nbatoms + 1)] = state->type;

	    for (j = 0;j < state->nbTrans;j++) {
		trans = &(state->trans[j]);
		if ((trans->to < 0) || (trans->atom == NULL))
		    continue;
                atomno = stringRemap[trans->atom->no];
		if ((trans->atom->data != NULL) && (transdata == NULL)) {
		    transdata = (void **) xmlRegCalloc2(nbstates, nbatoms,
			                                sizeof(void *));
		    if (transdata == NULL) {
			xmlRegexpErrMemory(ctxt);
			break;
		    }
		}
		targetno = stateRemap[trans->to];
		/*
		 * if the same atom can generate transitions to 2 different
		 * states then it means the automata is not deterministic and
		 * the compact form can't be used !
		 */
		prev = transitions[stateno * (nbatoms + 1) + atomno + 1];
		if (prev != 0) {
		    if (prev != targetno + 1) {
			ret->determinist = 0;
			if (transdata != NULL)
			    xmlFree(transdata);
			xmlFree(transitions);
			xmlFree(stateRemap);
			xmlFree(stringRemap);
			for (i = 0;i < nbatoms;i++)
			    xmlFree(stringMap[i]);
			xmlFree(stringMap);
			goto not_determ;
		    }
		} else {
		    transitions[stateno * (nbatoms + 1) + atomno + 1] =
			targetno + 1; /* to avoid 0 */
		    if (transdata != NULL)
			transdata[stateno * nbatoms + atomno] =
			    trans->atom->data;
		}
	    }
	}
	ret->determinist = 1;
	/*
	 * Cleanup of the old data
	 */
	if (ret->states != NULL) {
	    for (i = 0;i < ret->nbStates;i++)
		xmlRegFreeState(ret->states[i]);
	    xmlFree(ret->states);
	}
	ret->states = NULL;
	ret->nbStates = 0;
	if (ret->atoms != NULL) {
	    for (i = 0;i < ret->nbAtoms;i++)
		xmlRegFreeAtom(ret->atoms[i]);
	    xmlFree(ret->atoms);
	}
	ret->atoms = NULL;
	ret->nbAtoms = 0;

	ret->compact = transitions;
	ret->transdata = transdata;
	ret->stringMap = stringMap;
	ret->nbstrings = nbatoms;
	ret->nbstates = nbstates;
	xmlFree(stateRemap);
	xmlFree(stringRemap);
    }
not_determ:
    ctxt->string = NULL;
    ctxt->nbStates = 0;
    ctxt->states = NULL;
    ctxt->nbAtoms = 0;
    ctxt->atoms = NULL;
    ctxt->nbCounters = 0;
    ctxt->counters = NULL;
    return(ret);
}